

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnImportMemory
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index memory_index,Limits *page_limits,uint32_t page_size)

{
  ModuleDesc *pMVar1;
  Result RVar2;
  Enum EVar3;
  ulong uVar4;
  ulong uVar5;
  Location loc;
  undefined1 local_100 [16];
  char *local_f0;
  value_type local_e8;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  long *local_98;
  long local_90;
  long local_88 [2];
  Location local_78;
  long *local_58 [2];
  long local_48 [2];
  _func_int **local_38;
  
  local_f0 = module_name._M_str;
  local_78.field_1.field_0.last_column = 0;
  local_78.filename._M_len = (this->filename_)._M_len;
  local_78.filename._M_str = (this->filename_)._M_str;
  local_78.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar2 = SharedValidator::OnMemory(&this->validator_,&local_78,page_limits,page_size);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    local_e8.limits.initial._0_4_ = (uint32_t)page_limits->initial;
    local_e8.limits.initial._4_4_ = *(undefined4 *)((long)&page_limits->initial + 4);
    local_e8.limits.max = page_limits->max;
    local_e8.limits.has_max = page_limits->has_max;
    local_e8.limits.is_shared = page_limits->is_shared;
    local_e8.limits.is_64 = page_limits->is_64;
    local_e8.limits._23_1_ = page_limits->field_0x17;
    local_e8.limits._19_4_ = *(undefined4 *)&page_limits->field_0x13;
    local_e8.super_ExternType.kind = Memory;
    local_e8.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002461b0;
    local_e8.page_size = page_size;
    local_100._8_8_ = field_name._M_str;
    if ((local_e8.limits.has_max & 1U) == 0) {
      if ((page_size ^ page_size - 1) <= page_size - 1) {
        abort();
      }
      uVar5 = -(ulong)(local_e8.limits.is_64 & 1) | 0xffffffff;
      uVar4 = uVar5 / page_size;
      local_e8.limits.max = (page_size * uVar4 - uVar5 != 0) + uVar4;
    }
    pMVar1 = this->module_;
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,local_f0,local_f0 + module_name._M_len);
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,local_100._8_8_,(char *)(local_100._8_8_ + field_name._M_len));
    MemoryType::Clone((MemoryType *)local_100);
    local_78.filename._M_len = (size_t)&local_78.field_1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_98,local_90 + (long)local_98);
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>((string *)local_58,local_b8,local_b0 + (long)local_b8)
    ;
    local_38 = (_func_int **)local_100._0_8_;
    local_100._0_8_ = (_func_int **)0x0;
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::
    emplace_back<wabt::interp::ImportDesc>(&pMVar1->imports,(ImportDesc *)&local_78);
    if (local_38 != (_func_int **)0x0) {
      (**(code **)(*local_38 + 8))();
    }
    local_38 = (_func_int **)0x0;
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_78.filename._M_len != &local_78.field_1) {
      operator_delete((void *)local_78.filename._M_len,(long)local_78.field_1.field_1.offset + 1);
    }
    if ((_func_int **)local_100._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_100._0_8_ + 8))();
    }
    local_100._0_8_ = (_func_int **)0x0;
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
    std::vector<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>::push_back
              (&this->memory_types_,&local_e8);
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnImportMemory(Index import_index,
                                          std::string_view module_name,
                                          std::string_view field_name,
                                          Index memory_index,
                                          const Limits* page_limits,
                                          uint32_t page_size) {
  CHECK_RESULT(validator_.OnMemory(GetLocation(), *page_limits, page_size));
  MemoryType memory_type{*page_limits, page_size};
  module_.imports.push_back(ImportDesc{ImportType(
      std::string(module_name), std::string(field_name), memory_type.Clone())});
  memory_types_.push_back(memory_type);
  return Result::Ok;
}